

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::Recycled(Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this)

{
  Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
  *pSVar1;
  
  pSVar1 = mem();
  if (pSVar1->_cursor != pSVar1->_stack) {
    mem();
    Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
    ::pop((Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
           *)this);
    return;
  }
  std::make_unique<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>>>();
  return;
}

Assistant:

Recycled()
    : _self(mem().isNonEmpty() ? mem().pop() : IF_USE_PTRS(std::make_unique<T>(), T()))
  { }